

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O0

void embree::parseParm(Ref<embree::Stream<embree::Token>_> *cin,
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *parms)

{
  bool bVar1;
  Stream<embree::Token> *this;
  Token *pTVar2;
  undefined8 *in_RDI;
  string name;
  Token *in_stack_fffffffffffffd98;
  Token *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  size_t in_stack_fffffffffffffdb8;
  key_type *__k;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  string *in_stack_fffffffffffffdf8;
  Token *in_stack_fffffffffffffe08;
  string local_1c8 [16];
  ParseLocation *in_stack_fffffffffffffe48;
  Stream<embree::Token> *in_stack_fffffffffffffe60;
  string local_180 [39];
  undefined1 local_159 [265];
  string local_50 [40];
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  
  local_28 = in_RDI;
  Stream<embree::Token>::get(in_stack_fffffffffffffe60);
  Token::Identifier_abi_cxx11_(in_stack_fffffffffffffe08);
  Token::~Token(in_stack_fffffffffffffda0);
  local_10 = local_28;
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)*local_28;
  Stream<embree::Token>::get(in_stack_fffffffffffffe60);
  __k = (key_type *)local_159;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_159 + 1),"=",(allocator *)__k);
  Token::Sym(in_stack_fffffffffffffdf8);
  bVar1 = operator!=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  Token::~Token(in_stack_fffffffffffffda0);
  std::__cxx11::string::~string((string *)(local_159 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_159);
  Token::~Token(in_stack_fffffffffffffda0);
  if (!bVar1) {
    local_20 = local_28;
    Stream<embree::Token>::get(in_stack_fffffffffffffe60);
    Token::String_abi_cxx11_(in_stack_fffffffffffffe08);
    pTVar2 = (Token *)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](this_00,__k);
    std::__cxx11::string::operator=((string *)pTVar2,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    Token::~Token(pTVar2);
    std::__cxx11::string::~string(local_50);
    return;
  }
  this = (Stream<embree::Token> *)__cxa_allocate_exception(0x10);
  local_18 = local_28;
  pTVar2 = Stream<embree::Token>::unget(this,in_stack_fffffffffffffdb8);
  Token::Location(pTVar2);
  ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffe48);
  std::operator+(in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
  std::runtime_error::runtime_error((runtime_error *)this,local_180);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parseParm(Ref<Stream<Token> >& cin, std::map<std::string,std::string>& parms)
  {
    std::string name = cin->get().Identifier();
    if (cin->get() != Token::Sym("=")) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": symbol \"=\" expected");
    parms[name] = cin->get().String();
  }